

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctime_s.c
# Opt level: O0

errno_t ctime_s(char *s,rsize_t maxsize,time_t *timer)

{
  tm *timeptr;
  undefined1 local_4c [8];
  tm tm;
  time_t *timer_local;
  rsize_t maxsize_local;
  char *s_local;
  
  tm._28_8_ = timer;
  if ((((s == (char *)0x0) || (timer == (time_t *)0x0)) || (maxsize < 0x1a)) ||
     (0x7fffffffffffffff < maxsize)) {
    if (((s != (char *)0x0) && (maxsize != 0)) && (maxsize < 0x8000000000000000)) {
      *s = '\0';
    }
    (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
    s_local._4_4_ = 0x16;
  }
  else {
    timeptr = localtime_s(timer,(tm *)local_4c);
    s_local._4_4_ = asctime_s(s,maxsize,timeptr);
  }
  return s_local._4_4_;
}

Assistant:

errno_t ctime_s( char * s, rsize_t maxsize, const time_t * timer )
{
    struct tm tm;

    if ( s == NULL || timer == NULL || maxsize < 26 || maxsize > RSIZE_MAX )
    {
        if ( s != NULL && maxsize > 0 && maxsize <= RSIZE_MAX )
        {
            s[0] = '\0';
        }

        _PDCLIB_constraint_handler( _PDCLIB_CONSTRAINT_VIOLATION( _PDCLIB_EINVAL ) );
        return _PDCLIB_EINVAL;
    }

    return asctime_s( s, maxsize, localtime_s( timer, &tm ) );
}